

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O3

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadGeometryVertexElement
          (OgreBinarySerializer *this,VertexData *dest)

{
  pointer *ppVVar1;
  iterator __position;
  unsigned_short uVar2;
  Logger *this_00;
  VertexElement element;
  VertexElement local_200;
  string local_1f0;
  string local_1d0;
  long *local_1b0;
  long local_1a0 [2];
  undefined1 local_190 [376];
  
  VertexElement::VertexElement(&local_200);
  local_200.source = StreamReader<false,_false>::Get<unsigned_short>(this->m_reader);
  uVar2 = StreamReader<false,_false>::Get<unsigned_short>(this->m_reader);
  local_200.type = (Type)uVar2;
  uVar2 = StreamReader<false,_false>::Get<unsigned_short>(this->m_reader);
  local_200.semantic = (Semantic)uVar2;
  local_200.offset = StreamReader<false,_false>::Get<unsigned_short>(this->m_reader);
  local_200.index = StreamReader<false,_false>::Get<unsigned_short>(this->m_reader);
  this_00 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[22]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190,
             (char (*) [22])"    - Vertex element ");
  VertexElement::SemanticToString_abi_cxx11_(&local_1d0,&local_200);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190," of type ",9);
  VertexElement::TypeToString_abi_cxx11_(&local_1f0,&local_200);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190," index=",7);
  std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190," source=",8);
  std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__cxx11::stringbuf::str();
  Logger::debug(this_00,(char *)local_1b0);
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0,local_1a0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  __position._M_current =
       (dest->vertexElements).
       super__Vector_base<Assimp::Ogre::VertexElement,_std::allocator<Assimp::Ogre::VertexElement>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (dest->vertexElements).
      super__Vector_base<Assimp::Ogre::VertexElement,_std::allocator<Assimp::Ogre::VertexElement>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Assimp::Ogre::VertexElement,std::allocator<Assimp::Ogre::VertexElement>>::
    _M_realloc_insert<Assimp::Ogre::VertexElement_const&>
              ((vector<Assimp::Ogre::VertexElement,std::allocator<Assimp::Ogre::VertexElement>> *)
               &dest->vertexElements,__position,&local_200);
  }
  else {
    (__position._M_current)->index = local_200.index;
    (__position._M_current)->source = local_200.source;
    (__position._M_current)->offset = local_200.offset;
    *(undefined2 *)&(__position._M_current)->field_0x6 = local_200._6_2_;
    (__position._M_current)->type = local_200.type;
    (__position._M_current)->semantic = local_200.semantic;
    ppVVar1 = &(dest->vertexElements).
               super__Vector_base<Assimp::Ogre::VertexElement,_std::allocator<Assimp::Ogre::VertexElement>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppVVar1 = *ppVVar1 + 1;
  }
  return;
}

Assistant:

void OgreBinarySerializer::ReadGeometryVertexElement(VertexData *dest)
{
    VertexElement element;
    element.source = Read<uint16_t>();
    element.type = static_cast<VertexElement::Type>(Read<uint16_t>());
    element.semantic = static_cast<VertexElement::Semantic>(Read<uint16_t>());
    element.offset = Read<uint16_t>();
    element.index = Read<uint16_t>();

    ASSIMP_LOG_DEBUG_F( "    - Vertex element ", element.SemanticToString(), " of type ",
        element.TypeToString(), " index=", element.index, " source=", element.source);

    dest->vertexElements.push_back(element);
}